

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counters.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Counters::entities_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Counters *this)

{
  Client *client;
  allocator<char> local_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  char local_70 [8];
  undefined8 uStack_68;
  Path local_60;
  Url local_40;
  
  client = *(Client **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"entities",&local_81);
  local_60.value_._M_dataplus._M_p = (pointer)&local_60.value_.field_2;
  if (local_80 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70) {
    local_60.value_.field_2._8_8_ = uStack_68;
  }
  else {
    local_60.value_._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.value_._M_string_length = local_78;
  local_78 = 0;
  local_70[0] = '\0';
  local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70;
  getUrl(&local_40,this,&local_60);
  HttpConsumer::get(__return_storage_ptr__,client,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Counters::entities() {
  return HttpConsumer::get(client_, getUrl(Path{"entities"}));
}